

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

void oss_x509_share_free(void *key,size_t key_len,void *p)

{
  if (*(X509_STORE **)((long)p + 8) != (X509_STORE *)0x0) {
    X509_STORE_free(*(X509_STORE **)((long)p + 8));
  }
  (*Curl_cfree)(*p);
  (*Curl_cfree)(p);
  return;
}

Assistant:

static void oss_x509_share_free(void *key, size_t key_len, void *p)
{
  struct ossl_x509_share *share = p;
  DEBUGASSERT(key_len == (sizeof(MPROTO_OSSL_X509_KEY)-1));
  DEBUGASSERT(!memcmp(MPROTO_OSSL_X509_KEY, key, key_len));
  (void)key;
  (void)key_len;
  if(share->store) {
    X509_STORE_free(share->store);
  }
  free(share->CAfile);
  free(share);
}